

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  ValueHolder *pVVar1;
  ostream *poVar2;
  ValueHolder *local_68;
  GTestLog local_58;
  int local_54;
  ValueHolder *pVStack_50;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  undefined1 local_31;
  ValueHolder *local_30;
  ValueHolder *local_28;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  ThreadLocal<testing::TestPartResultReporterInterface_*> *this_local;
  
  holder = (ThreadLocalValueHolderBase *)this;
  new_holder = (ValueHolder *)pthread_getspecific(this->key_);
  if (new_holder == (ValueHolder *)0x0) {
    pVVar1 = (ValueHolder *)operator_new(0x10);
    local_31 = 0;
    local_68 = (ValueHolder *)0x0;
    if (pVVar1 != (ValueHolder *)0x0) {
      local_31 = 1;
      local_30 = pVVar1;
      ValueHolder::ValueHolder(pVVar1,&this->default_);
      local_68 = pVVar1;
    }
    local_28 = local_68;
    pVStack_50 = local_68;
    local_54 = pthread_setspecific(this->key_,local_68);
    if (local_54 != 0) {
      GTestLog::GTestLog(&local_58,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/googletest/gtest/gtest.h"
                         ,0xa50);
      poVar2 = GTestLog::GetStream(&local_58);
      poVar2 = std::operator<<(poVar2,"pthread_setspecific(key_, holder_base)");
      poVar2 = std::operator<<(poVar2,"failed with error ");
      std::ostream::operator<<(poVar2,local_54);
      GTestLog::~GTestLog(&local_58);
    }
    this_local = (ThreadLocal<testing::TestPartResultReporterInterface_*> *)
                 ValueHolder::pointer(local_28);
  }
  else {
    pVVar1 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                       ((ThreadLocalValueHolderBase *)new_holder);
    this_local = (ThreadLocal<testing::TestPartResultReporterInterface_*> *)
                 ValueHolder::pointer(pVVar1);
  }
  return (TestPartResultReporterInterface **)this_local;
}

Assistant:

T* GetOrCreateValue() const {
                ThreadLocalValueHolderBase* const holder =
                    static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
                if (holder != NULL) {
                    return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
                }

                ValueHolder* const new_holder = new ValueHolder(default_);
                ThreadLocalValueHolderBase* const holder_base = new_holder;
                GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
                return new_holder->pointer();
            }